

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

time_t __thiscall Time::LocalTime::asNative(LocalTime *this)

{
  time_t tVar1;
  time_t tVar2;
  tm utcT;
  tm ekT;
  time_t local_a0;
  tm local_98;
  tm local_58;
  
  local_58.tm_isdst = 0;
  local_58._36_4_ = 0;
  local_58.tm_gmtoff = 0;
  local_58.tm_mon = 0;
  local_58.tm_year = 0;
  local_58.tm_wday = 0;
  local_58.tm_yday = 0;
  local_58.tm_sec = 0;
  local_58.tm_min = 0;
  local_58.tm_hour = 0;
  local_58.tm_mday = 0;
  local_58.tm_zone = (char *)0x0;
  local_98._0_8_ = (this->super_Time).timeSinceEpoch.tv_sec;
  localtime_r((time_t *)&local_98,&local_58);
  local_98.tm_zone = (char *)0x0;
  local_98.tm_isdst = 0;
  local_98._36_4_ = 0;
  local_98.tm_gmtoff = 0;
  local_98.tm_mon = 0;
  local_98.tm_year = 0;
  local_98.tm_wday = 0;
  local_98.tm_yday = 0;
  local_98.tm_sec = 0;
  local_98.tm_min = 0;
  local_98.tm_hour = 0;
  local_98.tm_mday = 0;
  tVar1 = time((time_t *)0x0);
  local_a0 = tVar1;
  gmtime_r(&local_a0,&local_98);
  local_98.tm_isdst = local_58.tm_isdst;
  tVar2 = mktime(&local_98);
  return (tVar1 - tVar2) + (this->super_Time).timeSinceEpoch.tv_sec;
}

Assistant:

time_t LocalTime::asNative() const
    {
        struct tm ekT = {0};
        makeLocalTime(timeSinceEpoch.tv_sec, ekT);
        struct tm utcT = {0};
        time_t start = time(NULL);
        makeUTCTime(start, utcT);
        utcT.tm_isdst = ekT.tm_isdst;

        // Compute offset from GMT and localtime, including DST
        time_t offset = makeTime(&utcT) - start;
        return timeSinceEpoch.tv_sec - offset;
    }